

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

void usage(char *argv0,char mode,int expected)

{
  uint local_1c;
  int i;
  int expected_local;
  char mode_local;
  char *argv0_local;
  
  if (expected != 0) {
    fprintf(_stderr,"Error: incorrect number of args for mode -%c: %d args required\n",
            (ulong)(uint)(int)mode,(ulong)(uint)expected);
  }
  for (local_1c = 0; local_1c < 0xb; local_1c = local_1c + 1) {
    fprintf(_stderr,usage_info[(int)local_1c],argv0);
  }
  exit(1);
}

Assistant:

static NORETURN void usage(char *argv0, char mode, int expected)
{
	int i;
	if (expected)
	    fprintf(stderr, "Error: incorrect number of args for mode -%c: %d args required\n", mode, expected);
	
	for (i = 0; i < sizeof(usage_info)/sizeof(usage_info[0]); i++)
	    fprintf(stderr, usage_info[i], argv0);
	
	exit(1);
}